

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cc
# Opt level: O2

void anon_unknown.dwarf_1d6b::PrintUsage(ostream *stream)

{
  long lVar1;
  ostream *poVar2;
  
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream," quantize - uniform quantization");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream,"  usage:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       quantize [ options ] [ infile ] > stdout");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  options:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -v v  : absolute maximum of input (double)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = std::ostream::_M_insert<double>(32768.0);
  poVar2 = std::operator<<(poVar2,"][ 0.0 <  v <=   ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -b b  : number of bits per sample (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,8);
  poVar2 = std::operator<<(poVar2,"][   1 <= b <=   ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -t t  : quantization type         (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0);
  poVar2 = std::operator<<(poVar2,"][   0 <= t <= 1 ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"                 0 (mid-rise)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"                 1 (mid-tread)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -o o  : output format             (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0);
  poVar2 = std::operator<<(poVar2,"][   0 <= o <= 1 ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"                 0 (non-negative integer)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"                 1 (integer)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -h    : print this message");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  infile:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       data sequence                     (double)[stdin]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  stdout:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       quantized data sequence           (   int)");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream," SPTK: version ");
  poVar2 = std::operator<<(poVar2,"4.3");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(stream);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " quantize - uniform quantization" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       quantize [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -v v  : absolute maximum of input (double)[" << std::setw(5) << std::right << kDefaultAbsoluteMaximumValue << "][ 0.0 <  v <=   ]" << std::endl;  // NOLINT
  *stream << "       -b b  : number of bits per sample (   int)[" << std::setw(5) << std::right << kDefaultNumBit               << "][   1 <= b <=   ]" << std::endl;  // NOLINT
  *stream << "       -t t  : quantization type         (   int)[" << std::setw(5) << std::right << kDefaultQuantizationType     << "][   0 <= t <= 1 ]" << std::endl;  // NOLINT
  *stream << "                 0 (mid-rise)"  << std::endl;
  *stream << "                 1 (mid-tread)"  << std::endl;
  *stream << "       -o o  : output format             (   int)[" << std::setw(5) << std::right << kDefaultOutputFormat         << "][   0 <= o <= 1 ]" << std::endl;  // NOLINT
  *stream << "                 0 (non-negative integer)"  << std::endl;
  *stream << "                 1 (integer)"  << std::endl;
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       data sequence                     (double)[stdin]" << std::endl;  // NOLINT
  *stream << "  stdout:" << std::endl;
  *stream << "       quantized data sequence           (   int)" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}